

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

void __thiscall KDIS::NETWORK::Connection::AddSubscriber(Connection *this,ConnectionSubscriber *S)

{
  ConnectionSubscriber *local_18;
  ConnectionSubscriber *S_local;
  Connection *this_local;
  
  if (S != (ConnectionSubscriber *)0x0) {
    local_18 = S;
    S_local = (ConnectionSubscriber *)this;
    std::
    vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
    ::push_back(&this->m_vpSubscribers,&local_18);
  }
  return;
}

Assistant:

void Connection::AddSubscriber( ConnectionSubscriber * S )
{
    if( S )
    {
        m_vpSubscribers.push_back( S );
    }
}